

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> __thiscall
cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  pointer *ppDVar1;
  pointer *ppcVar2;
  iterator __position;
  iterator __position_00;
  undefined1 auVar3 [12];
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar4;
  value_type index_entry;
  int local_64;
  pair<const_cmLinkItem,_int> local_60;
  
  local_64 = (int)((ulong)((long)(this->EntryList).
                                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->EntryList).
                                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555;
  std::pair<const_cmLinkItem,_int>::pair<int,_true>(&local_60,item,&local_64);
  pVar4 = std::
          _Rb_tree<cmLinkItem,std::pair<cmLinkItem_const,int>,std::_Select1st<std::pair<cmLinkItem_const,int>>,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
          ::_M_emplace_unique<std::pair<cmLinkItem_const,int>&>
                    ((_Rb_tree<cmLinkItem,std::pair<cmLinkItem_const,int>,std::_Select1st<std::pair<cmLinkItem_const,int>>,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
                      *)&this->LinkEntryIndex,&local_60);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
    emplace_back<>(&this->EntryList);
    __position._M_current =
         (this->InferredDependSets).
         super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->InferredDependSets).
        super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
      ::_M_realloc_insert<>(&this->InferredDependSets,__position);
    }
    else {
      ((__position._M_current)->
      super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
      ).
      super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined8 *)&(__position._M_current)->Initialized = 0;
      ((__position._M_current)->
      super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
      ).
      super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->
      super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
      ).
      super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ppDVar1 = &(this->InferredDependSets).
                 super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppDVar1 = *ppDVar1 + 1;
    }
    __position_00._M_current =
         (this->EntryConstraintGraph).
         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
         super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
        .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::_M_realloc_insert<>
                (&(this->EntryConstraintGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,__position_00);
    }
    else {
      ((__position_00._M_current)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      ((__position_00._M_current)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ((__position_00._M_current)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ppcVar2 = &(this->EntryConstraintGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar2 = *ppcVar2 + 1;
    }
  }
  if (local_60.first.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.String._M_dataplus._M_p != &local_60.first.String.field_2) {
    operator_delete(local_60.first.String._M_dataplus._M_p,
                    local_60.first.String.field_2._M_allocated_capacity + 1);
  }
  auVar3 = pVar4._0_12_;
  pVar4._12_4_ = 0;
  pVar4.first._M_node = (_Base_ptr)auVar3._0_8_;
  pVar4.second = (bool)auVar3[8];
  pVar4._9_3_ = auVar3._9_3_;
  return pVar4;
}

Assistant:

std::pair<std::map<cmLinkItem, int>::iterator, bool>
cmComputeLinkDepends::AllocateLinkEntry(cmLinkItem const& item)
{
  std::map<cmLinkItem, int>::value_type index_entry(
    item, static_cast<int>(this->EntryList.size()));
  auto lei = this->LinkEntryIndex.insert(index_entry);
  if (lei.second) {
    this->EntryList.emplace_back();
    this->InferredDependSets.emplace_back();
    this->EntryConstraintGraph.emplace_back();
  }
  return lei;
}